

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O1

size_t __thiscall
llvm::DWARFAbbreviationDeclaration::FixedSizeInfo::getByteSize(FixedSizeInfo *this,DWARFUnit *U)

{
  byte bVar1;
  DwarfFormat DVar2;
  byte bVar3;
  long lVar4;
  size_t sVar5;
  
  lVar4 = (ulong)(U->Header).FormParams.AddrSize * (ulong)this->NumAddrs;
  if ((ulong)this->NumAddrs == 0) {
    lVar4 = 0;
  }
  sVar5 = lVar4 + (ulong)this->NumBytes;
  bVar1 = this->NumRefAddrs;
  if ((ulong)bVar1 != 0) {
    bVar3 = dwarf::FormParams::getRefAddrByteSize(&(U->Header).FormParams);
    sVar5 = sVar5 + (ulong)bVar3 * (ulong)bVar1;
  }
  if ((ulong)this->NumDwarfOffsets != 0) {
    DVar2 = (U->Header).FormParams.Format;
    lVar4 = 4;
    if (DVar2 != DWARF32) {
      if (DVar2 != DWARF64) {
        llvm_unreachable_internal
                  ("Invalid Format value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                   ,0x230);
      }
      lVar4 = 8;
    }
    sVar5 = sVar5 + lVar4 * (ulong)this->NumDwarfOffsets;
  }
  return sVar5;
}

Assistant:

size_t DWARFAbbreviationDeclaration::FixedSizeInfo::getByteSize(
    const DWARFUnit &U) const {
  size_t ByteSize = NumBytes;
  if (NumAddrs)
    ByteSize += NumAddrs * U.getAddressByteSize();
  if (NumRefAddrs)
    ByteSize += NumRefAddrs * U.getRefAddrByteSize();
  if (NumDwarfOffsets)
    ByteSize += NumDwarfOffsets * U.getDwarfOffsetByteSize();
  return ByteSize;
}